

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

int ov_halfrate(OggVorbis_File *vf,int flag)

{
  ogg_int64_t pos_00;
  int iVar1;
  ogg_int64_t pos;
  int i;
  int flag_local;
  OggVorbis_File *vf_local;
  
  if (vf->vi == (vorbis_info *)0x0) {
    vf_local._4_4_ = -0x83;
  }
  else {
    if (3 < vf->ready_state) {
      vorbis_dsp_clear(&vf->vd);
      vorbis_block_clear(&vf->vb);
      vf->ready_state = 3;
      if (-1 < vf->pcm_offset) {
        pos_00 = vf->pcm_offset;
        vf->pcm_offset = -1;
        ov_pcm_seek(vf,pos_00);
      }
    }
    for (pos._0_4_ = 0; (int)pos < vf->links; pos._0_4_ = (int)pos + 1) {
      iVar1 = vorbis_synthesis_halfrate(vf->vi + (int)pos,flag);
      if (iVar1 != 0) {
        if (flag != 0) {
          ov_halfrate(vf,0);
        }
        return -0x83;
      }
    }
    vf_local._4_4_ = 0;
  }
  return vf_local._4_4_;
}

Assistant:

int ov_halfrate(OggVorbis_File *vf,int flag){
  int i;
  if(vf->vi==NULL)return OV_EINVAL;
  if(vf->ready_state>STREAMSET){
    /* clear out stream state; dumping the decode machine is needed to
       reinit the MDCT lookups. */
    vorbis_dsp_clear(&vf->vd);
    vorbis_block_clear(&vf->vb);
    vf->ready_state=STREAMSET;
    if(vf->pcm_offset>=0){
      ogg_int64_t pos=vf->pcm_offset;
      vf->pcm_offset=-1; /* make sure the pos is dumped if unseekable */
      ov_pcm_seek(vf,pos);
    }
  }

  for(i=0;i<vf->links;i++){
    if(vorbis_synthesis_halfrate(vf->vi+i,flag)){
      if(flag) ov_halfrate(vf,0);
      return OV_EINVAL;
    }
  }
  return 0;
}